

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Optional.h
# Opt level: O2

Array<char,_void_(*)(char_*,_unsigned_long)> * __thiscall
Corrade::Containers::Optional<Corrade::Containers::Array<char,_void_(*)(char_*,_unsigned_long)>_>::
operator*(Optional<Corrade::Containers::Array<char,_void_(*)(char_*,_unsigned_long)>_> *this)

{
  ostream *output;
  Error local_30;
  
  if (this->_set != false) {
    return (Array<char,_void_(*)(char_*,_unsigned_long)> *)this;
  }
  output = Utility::Error::defaultOutput();
  Utility::Error::Error(&local_30,output,(Flags)0x0);
  Utility::Debug::operator<<(&local_30.super_Debug,"Containers::Optional: the optional is empty");
  Utility::Error::~Error(&local_30);
  abort();
}

Assistant:

const T& operator*() const & {
            CORRADE_DEBUG_ASSERT(_set, "Containers::Optional: the optional is empty", _value);
            return _value;
        }